

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O1

void __thiscall wasm::RemoveUnusedBrs::removeValueFlow(RemoveUnusedBrs *this,Flows *currFlows)

{
  Expression ***pppEVar1;
  pointer pppEVar2;
  __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
  _Var3;
  pointer pppEVar4;
  
  _Var3 = std::
          __remove_if<__gnu_cxx::__normal_iterator<wasm::Expression***,std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>>,__gnu_cxx::__ops::_Iter_pred<wasm::RemoveUnusedBrs::removeValueFlow(std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>&)::_lambda(wasm::Expression**)_1_>>
                    ((currFlows->
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>).
                     _M_impl.super__Vector_impl_data._M_start,
                     (currFlows->
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>).
                     _M_impl.super__Vector_impl_data._M_finish);
  pppEVar1 = (currFlows->
             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if ((_Var3._M_current != pppEVar1) &&
     (pppEVar2 = (currFlows->
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
     pppEVar4 = (pointer)((long)_Var3._M_current + ((long)pppEVar2 - (long)pppEVar1)),
     pppEVar2 != pppEVar4)) {
    (currFlows->super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>).
    _M_impl.super__Vector_impl_data._M_finish = pppEVar4;
  }
  return;
}

Assistant:

void removeValueFlow(Flows& currFlows) {
    currFlows.erase(std::remove_if(currFlows.begin(),
                                   currFlows.end(),
                                   [&](Expression** currp) {
                                     auto* curr = *currp;
                                     if (auto* ret = curr->dynCast<Return>()) {
                                       return ret->value;
                                     }
                                     return curr->cast<Break>()->value;
                                   }),
                    currFlows.end());
  }